

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZydisFuzzShared.c
# Opt level: O2

void ZydisValidateEnumRanges
               (ZydisDecodedInstruction *insn,ZydisDecodedOperand *operands,ZyanU8 operand_count)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  char *__format;
  long lVar4;
  ulong uStack_30;
  
  uVar3 = (ulong)insn->length;
  if (0xf < uVar3) {
    __format = 
    "Value insn->length = 0x%016lX is above expected max ZYDIS_MAX_INSTRUCTION_LENGTH = 0x%016lX\n";
    uStack_30 = 0xf;
    goto LAB_0010eaa0;
  }
  uVar3 = (ulong)insn->machine_mode;
  if (uVar3 < 6) {
    uVar3 = (ulong)insn->mnemonic;
    if (0x703 < uVar3) {
      __format = 
      "Value insn->mnemonic = 0x%016lX is above expected max ZYDIS_MNEMONIC_MAX_VALUE = 0x%016lX\n";
      uStack_30 = 0x703;
      goto LAB_0010eaa0;
    }
    uVar3 = (ulong)insn->encoding;
    if (uVar3 < 6) {
      uVar3 = (ulong)insn->opcode_map;
      if (0xb < uVar3) {
        __format = 
        "Value insn->opcode_map = 0x%016lX is above expected max ZYDIS_OPCODE_MAP_MAX_VALUE = 0x%016lX\n"
        ;
        uStack_30 = 0xb;
        goto LAB_0010eaa0;
      }
      for (lVar4 = 0; (ulong)operand_count * 0x50 - lVar4 != 0; lVar4 = lVar4 + 0x50) {
        uVar1 = *(uint *)((long)&operands->type + lVar4);
        uVar2 = (ulong)uVar1;
        if (4 < uVar2) {
          __format = 
          "Value op->type = 0x%016lX is above expected max ZYDIS_OPERAND_TYPE_MAX_VALUE = 0x%016lX\n"
          ;
          uVar3 = uVar2;
          goto LAB_0010ea62;
        }
        uVar3 = (ulong)*(uint *)((long)&operands->visibility + lVar4);
        if (3 < uVar3) {
          __format = 
          "Value op->visibility = 0x%016lX is above expected max ZYDIS_OPERAND_VISIBILITY_MAX_VALUE = 0x%016lX\n"
          ;
          uStack_30 = 3;
          goto LAB_0010eaa0;
        }
        uVar3 = (ulong)*(uint *)((long)&operands->encoding + lVar4);
        if (0x22 < uVar3) {
          __format = 
          "Value op->encoding = 0x%016lX is above expected max ZYDIS_OPERAND_ENCODING_MAX_VALUE = 0x%016lX\n"
          ;
          uStack_30 = 0x22;
          goto LAB_0010eaa0;
        }
        uVar3 = (ulong)*(uint *)((long)&operands->element_type + lVar4);
        if (10 < uVar3) {
          __format = 
          "Value op->element_type = 0x%016lX is above expected max ZYDIS_ELEMENT_TYPE_MAX_VALUE = 0x%016lX\n"
          ;
          uStack_30 = 10;
          goto LAB_0010eaa0;
        }
        if (uVar2 == 4) {
          uVar3 = (ulong)*(byte *)((long)&operands->field_10 + lVar4);
          if (1 < uVar3) {
            __format = 
            "Value op->imm.is_signed = 0x%016lX is above expected max ZYAN_TRUE = 0x%016lX\n";
            goto LAB_0010ea9d;
          }
          uVar3 = (ulong)*(byte *)((long)&operands->field_10 + lVar4 + 1);
          if (1 < uVar3) {
            __format = 
            "Value op->imm.is_relative = 0x%016lX is above expected max ZYAN_TRUE = 0x%016lX\n";
            goto LAB_0010ea9d;
          }
          ZydisValidateImmediateSize((ulong)*(byte *)((long)&operands->field_10 + lVar4 + 0x11));
          uVar3 = (ulong)(*(byte *)((long)&operands->field_10 + lVar4 + 0x11) >> 3) +
                  (ulong)*(byte *)((long)&operands->field_10 + lVar4 + 0x10);
          uStack_30 = (ulong)insn->length;
          if (uStack_30 < uVar3) {
            __format = 
            "Value op->imm.offset + (op->imm.size / 8) = 0x%016lX is above expected max insn->length = 0x%016lX\n"
            ;
            goto LAB_0010eaa0;
          }
        }
        else if (uVar1 == 2) {
          uVar3 = (ulong)*(uint *)((long)&operands->field_10 + lVar4);
          if (4 < uVar3) {
            __format = 
            "Value op->mem.type = 0x%016lX is above expected max ZYDIS_MEMOP_TYPE_MAX_VALUE = 0x%016lX\n"
            ;
            goto LAB_0010ea62;
          }
          uVar3 = (ulong)*(uint *)((long)&operands->field_10 + lVar4 + 4);
          if (0x10a < uVar3) {
            __format = 
            "Value op->mem.segment = 0x%016lX is above expected max ZYDIS_REGISTER_MAX_VALUE = 0x%016lX\n"
            ;
            goto LAB_0010eaf6;
          }
          uVar3 = (ulong)*(uint *)((long)&operands->field_10 + lVar4 + 8);
          if (0x10a < uVar3) {
            __format = 
            "Value op->mem.base = 0x%016lX is above expected max ZYDIS_REGISTER_MAX_VALUE = 0x%016lX\n"
            ;
            goto LAB_0010eaf6;
          }
          uVar3 = (ulong)*(uint *)((long)&operands->field_10 + lVar4 + 0xc);
          if (0x10a < uVar3) {
            __format = 
            "Value op->mem.index = 0x%016lX is above expected max ZYDIS_REGISTER_MAX_VALUE = 0x%016lX\n"
            ;
            goto LAB_0010eaf6;
          }
          ZydisValidateImmediateSize((ulong)*(byte *)((long)&operands->field_10 + lVar4 + 0x21));
          uVar3 = (ulong)(*(byte *)((long)&operands->field_10 + lVar4 + 0x21) >> 3) +
                  (ulong)*(byte *)((long)&operands->field_10 + lVar4 + 0x20);
          uStack_30 = (ulong)insn->length;
          if (uStack_30 < uVar3) {
            __format = 
            "Value op->mem.disp.offset + (op->mem.disp.size / 8) = 0x%016lX is above expected max insn->length = 0x%016lX\n"
            ;
            goto LAB_0010eaa0;
          }
        }
        else if ((uVar1 == 1) &&
                (uVar3 = (ulong)*(uint *)((long)&operands->field_10 + lVar4), 0x10a < uVar3)) {
          __format = 
          "Value op->reg.value = 0x%016lX is above expected max ZYDIS_REGISTER_MAX_VALUE = 0x%016lX\n"
          ;
          goto LAB_0010eaf6;
        }
      }
      uVar3 = (ulong)(insn->avx).mask.mode;
      if (uVar3 < 6) {
        uVar3 = (ulong)(insn->avx).mask.reg;
        if (0x10a < uVar3) {
          __format = 
          "Value insn->avx.mask.reg = 0x%016lX is above expected max ZYDIS_REGISTER_MAX_VALUE = 0x%016lX\n"
          ;
LAB_0010eaf6:
          uStack_30 = 0x10a;
          goto LAB_0010eaa0;
        }
        uVar3 = (ulong)(insn->avx).broadcast.is_static;
        if (uVar3 < 2) {
          uVar3 = (ulong)(insn->avx).broadcast.mode;
          if (0xc < uVar3) {
            __format = 
            "Value insn->avx.broadcast.mode = 0x%016lX is above expected max ZYDIS_BROADCAST_MODE_MAX_VALUE = 0x%016lX\n"
            ;
            uStack_30 = 0xc;
            goto LAB_0010eaa0;
          }
          uVar3 = (ulong)(insn->avx).rounding.mode;
          if (4 < uVar3) {
            __format = 
            "Value insn->avx.rounding.mode = 0x%016lX is above expected max ZYDIS_ROUNDING_MODE_MAX_VALUE = 0x%016lX\n"
            ;
LAB_0010ea62:
            uStack_30 = 4;
            goto LAB_0010eaa0;
          }
          uVar3 = (ulong)(insn->avx).swizzle.mode;
          if (8 < uVar3) {
            __format = 
            "Value insn->avx.swizzle.mode = 0x%016lX is above expected max ZYDIS_SWIZZLE_MODE_MAX_VALUE = 0x%016lX\n"
            ;
            uStack_30 = 8;
            goto LAB_0010eaa0;
          }
          uVar3 = (ulong)(insn->avx).conversion.mode;
          if (5 < uVar3) {
            __format = 
            "Value insn->avx.conversion.mode = 0x%016lX is above expected max ZYDIS_CONVERSION_MODE_MAX_VALUE = 0x%016lX\n"
            ;
            goto LAB_0010ec0c;
          }
          uVar3 = (ulong)(insn->avx).has_sae;
          if (uVar3 < 2) {
            uVar3 = (ulong)(insn->avx).has_eviction_hint;
            if (uVar3 < 2) {
              uVar3 = (ulong)(insn->meta).category;
              if (uVar3 < 0x75) {
                uVar3 = (ulong)(insn->meta).isa_set;
                if (uVar3 < 200) {
                  uVar3 = (ulong)(insn->meta).isa_ext;
                  if (uVar3 < 200) {
                    uVar3 = (ulong)(insn->meta).branch_type;
                    if (uVar3 < 4) {
                      uVar3 = (ulong)(insn->meta).exception_class;
                      if (uVar3 < 0x2e) {
                        lVar4 = 0;
                        do {
                          if (lVar4 == 0xf) {
                            lVar4 = 0;
                            goto LAB_0010e983;
                          }
                          uVar3 = (ulong)(insn->raw).prefixes[lVar4].type;
                          lVar4 = lVar4 + 1;
                        } while (uVar3 < 3);
                        __format = 
                        "Value insn->raw.prefixes[i].type = 0x%016lX is above expected max ZYDIS_PREFIX_TYPE_MAX_VALUE = 0x%016lX\n"
                        ;
                        uStack_30 = 2;
                      }
                      else {
                        __format = 
                        "Value insn->meta.exception_class = 0x%016lX is above expected max ZYDIS_EXCEPTION_CLASS_MAX_VALUE = 0x%016lX\n"
                        ;
                        uStack_30 = 0x2d;
                      }
                    }
                    else {
                      __format = 
                      "Value insn->meta.branch_type = 0x%016lX is above expected max ZYDIS_BRANCH_TYPE_MAX_VALUE = 0x%016lX\n"
                      ;
                      uStack_30 = 3;
                    }
                    goto LAB_0010eaa0;
                  }
                  __format = 
                  "Value insn->meta.isa_ext = 0x%016lX is above expected max ZYDIS_ISA_SET_MAX_VALUE = 0x%016lX\n"
                  ;
                }
                else {
                  __format = 
                  "Value insn->meta.isa_set = 0x%016lX is above expected max ZYDIS_ISA_SET_MAX_VALUE = 0x%016lX\n"
                  ;
                }
                uStack_30 = 199;
              }
              else {
                __format = 
                "Value insn->meta.category = 0x%016lX is above expected max ZYDIS_CATEGORY_MAX_VALUE = 0x%016lX\n"
                ;
                uStack_30 = 0x74;
              }
              goto LAB_0010eaa0;
            }
            __format = 
            "Value insn->avx.has_eviction_hint = 0x%016lX is above expected max ZYAN_TRUE = 0x%016lX\n"
            ;
          }
          else {
            __format = 
            "Value insn->avx.has_sae = 0x%016lX is above expected max ZYAN_TRUE = 0x%016lX\n";
          }
        }
        else {
          __format = 
          "Value insn->avx.broadcast.is_static = 0x%016lX is above expected max ZYAN_TRUE = 0x%016lX\n"
          ;
        }
LAB_0010ea9d:
        uStack_30 = 1;
      }
      else {
        __format = 
        "Value insn->avx.mask.mode = 0x%016lX is above expected max ZYDIS_MASK_MODE_MAX_VALUE = 0x%016lX\n"
        ;
LAB_0010ec0c:
        uStack_30 = 5;
      }
      goto LAB_0010eaa0;
    }
    __format = 
    "Value insn->encoding = 0x%016lX is above expected max ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE = 0x%016lX\n"
    ;
  }
  else {
    __format = 
    "Value insn->machine_mode = 0x%016lX is above expected max ZYDIS_MACHINE_MODE_MAX_VALUE = 0x%016lX\n"
    ;
  }
  uStack_30 = 5;
LAB_0010eaa0:
  fprintf(_stderr,__format,uVar3,uStack_30);
  abort();
  while (uVar3 = (ulong)(&(insn->raw).imm[0].is_relative)[lVar4], lVar4 = lVar4 + 0x18, uVar3 < 2) {
LAB_0010e983:
    if (lVar4 + 0x18 == 0x48) {
      return;
    }
    uVar3 = (ulong)(&(insn->raw).imm[0].is_signed)[lVar4];
    if (1 < uVar3) {
      __format = 
      "Value insn->raw.imm[i].is_signed = 0x%016lX is above expected max ZYAN_TRUE = 0x%016lX\n";
      goto LAB_0010ea9d;
    }
  }
  __format = 
  "Value insn->raw.imm[i].is_relative = 0x%016lX is above expected max ZYAN_TRUE = 0x%016lX\n";
  goto LAB_0010ea9d;
}

Assistant:

void ZydisValidateEnumRanges(const ZydisDecodedInstruction* insn,
    const ZydisDecodedOperand* operands, ZyanU8 operand_count)
{
#   define ZYDIS_CHECK_ENUM(value, max)                                                            \
    if ((ZyanU64)(value) > (ZyanU64)(max))                                                         \
    {                                                                                              \
        fprintf(stderr, "Value " #value " = 0x%016" PRIX64 " is above expected max " #max          \
            " = 0x%016" PRIX64 "\n", (ZyanU64)(value), (ZyanU64)(max));                            \
        abort();                                                                                   \
    }
#   define ZYDIS_CHECK_MAX ZYDIS_CHECK_ENUM

    ZYDIS_CHECK_ENUM(insn->length, ZYDIS_MAX_INSTRUCTION_LENGTH);

    ZYDIS_CHECK_ENUM(insn->machine_mode, ZYDIS_MACHINE_MODE_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->mnemonic, ZYDIS_MNEMONIC_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->encoding, ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->opcode_map, ZYDIS_OPCODE_MAP_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->opcode_map, ZYDIS_OPCODE_MAP_MAX_VALUE);

    // Operands.
    for (ZyanU32 i = 0; i < operand_count; ++i)
    {
        const ZydisDecodedOperand* op = &operands[i];
        ZYDIS_CHECK_ENUM(op->type, ZYDIS_OPERAND_TYPE_MAX_VALUE);
        ZYDIS_CHECK_ENUM(op->visibility, ZYDIS_OPERAND_VISIBILITY_MAX_VALUE);
        ZYDIS_CHECK_ENUM(op->encoding, ZYDIS_OPERAND_ENCODING_MAX_VALUE);
        ZYDIS_CHECK_ENUM(op->element_type, ZYDIS_ELEMENT_TYPE_MAX_VALUE);

        switch (op->type)
        {
        case ZYDIS_OPERAND_TYPE_REGISTER:
            ZYDIS_CHECK_ENUM(op->reg.value, ZYDIS_REGISTER_MAX_VALUE);
            break;
        case ZYDIS_OPERAND_TYPE_MEMORY:
            ZYDIS_CHECK_ENUM(op->mem.type, ZYDIS_MEMOP_TYPE_MAX_VALUE);
            ZYDIS_CHECK_ENUM(op->mem.segment, ZYDIS_REGISTER_MAX_VALUE);
            ZYDIS_CHECK_ENUM(op->mem.base, ZYDIS_REGISTER_MAX_VALUE);
            ZYDIS_CHECK_ENUM(op->mem.index, ZYDIS_REGISTER_MAX_VALUE);
            ZydisValidateImmediateSize(op->mem.disp.size);
            ZYDIS_CHECK_MAX(op->mem.disp.offset + (op->mem.disp.size / 8), insn->length);
            break;
        case ZYDIS_OPERAND_TYPE_IMMEDIATE:
            ZYDIS_CHECK_ENUM(op->imm.is_signed, ZYAN_TRUE);
            ZYDIS_CHECK_ENUM(op->imm.is_relative, ZYAN_TRUE);
            ZydisValidateImmediateSize(op->imm.size);
            ZYDIS_CHECK_MAX(op->imm.offset + (op->imm.size / 8), insn->length);
            break;
        default:
            break;
        }
    }

    // AVX.
    ZYDIS_CHECK_ENUM(insn->avx.mask.mode, ZYDIS_MASK_MODE_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->avx.mask.reg, ZYDIS_REGISTER_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->avx.broadcast.is_static, ZYAN_TRUE);
    ZYDIS_CHECK_ENUM(insn->avx.broadcast.mode, ZYDIS_BROADCAST_MODE_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->avx.rounding.mode, ZYDIS_ROUNDING_MODE_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->avx.swizzle.mode, ZYDIS_SWIZZLE_MODE_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->avx.conversion.mode, ZYDIS_CONVERSION_MODE_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->avx.has_sae, ZYAN_TRUE);
    ZYDIS_CHECK_ENUM(insn->avx.has_eviction_hint, ZYAN_TRUE);

    // Meta.
    ZYDIS_CHECK_ENUM(insn->meta.category, ZYDIS_CATEGORY_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->meta.isa_set, ZYDIS_ISA_SET_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->meta.isa_ext, ZYDIS_ISA_SET_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->meta.branch_type, ZYDIS_BRANCH_TYPE_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->meta.exception_class, ZYDIS_EXCEPTION_CLASS_MAX_VALUE);

    // Raw.
    for (ZyanU32 i = 0; i < ZYAN_ARRAY_LENGTH(insn->raw.prefixes); ++i)
    {
        ZYDIS_CHECK_ENUM(insn->raw.prefixes[i].type, ZYDIS_PREFIX_TYPE_MAX_VALUE);
    }
    for (ZyanU32 i = 0; i < ZYAN_ARRAY_LENGTH(insn->raw.imm); ++i)
    {
        ZYDIS_CHECK_ENUM(insn->raw.imm[i].is_signed, ZYAN_TRUE);
        ZYDIS_CHECK_ENUM(insn->raw.imm[i].is_relative, ZYAN_TRUE);
    }

#   undef ZYDIS_CHECK_ENUM
#   undef ZYDIS_CHECK_MAX
}